

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

vm_obj_id_t CVmObjStringBuffer::create(int in_root_set,int32_t alo,int32_t inc)

{
  vm_obj_id_t vVar1;
  int in_EDX;
  vm_obj_id_t id;
  int32_t in_stack_ffffffffffffffe8;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  
  vVar1 = vm_new_id(in_EDX,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(in_EDX,vVar1),in_stack_ffffffffffffffec);
  CVmObjStringBuffer((CVmObjStringBuffer *)CONCAT44(in_EDX,vVar1),in_stack_ffffffffffffffec,
                     in_stack_ffffffffffffffe8);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjStringBuffer::create(VMG_ int in_root_set,
                                       int32_t alo, int32_t inc)
{
    /* allocate the object ID */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);

    /* create the C++ object */
    new (vmg_ id) CVmObjStringBuffer(vmg_ alo, inc);

    /* return the new ID */
    return id;
}